

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O3

uint If_ManSatCheckXYall_int(void *pSat,int nLutSize,word *pTruth,int nVars,Vec_Int_t *vLits)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  uint local_d8;
  uint local_d4 [4];
  uint local_c4;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  word *local_58;
  Vec_Int_t *local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_50 = vLits;
  local_58 = pTruth;
  local_60 = pSat;
  if (4 < nLutSize - 2U) {
    __assert_fail("nLutSize >= 2 && nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10d,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  if ((nVars <= nLutSize) || (nLutSize * 2 <= nVars)) {
    __assert_fail("nLutSize < nVars && nVars <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10e,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  uVar12 = ~nVars + nLutSize * 2;
  if (((int)uVar12 < 0) || (nLutSize - 1U <= uVar12)) {
    __assert_fail("nShared >= 0 && nShared < nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                  ,0x10f,
                  "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
  }
  local_70 = CONCAT44(local_70._4_4_,uVar12);
  switch(nLutSize - 2U) {
  case 0:
    if (uVar12 != 0) {
      __assert_fail("nShared == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifSat.c"
                    ,0x112,
                    "unsigned int If_ManSatCheckXYall_int(void *, int, word *, int, Vec_Int_t *)");
    }
    uVar12 = 2;
    iVar4 = 0;
    do {
      iVar5 = iVar4 + 1;
      if (iVar5 < nVars) {
        iVar3 = iVar5;
        uVar9 = uVar12;
        do {
          uVar10 = 1 << ((char)iVar4 * '\x02' & 0x1fU) | 1 << (uVar9 & 0x1f);
          iVar2 = If_ManSatCheckXY(local_60,2,local_58,nVars,uVar10,(word *)0x0,(word *)0x0,local_50
                                  );
          if (iVar2 != 0) {
            return uVar10;
          }
          iVar3 = iVar3 + 1;
          uVar9 = uVar9 + 2;
        } while (nVars != iVar3);
      }
      uVar12 = uVar12 + 2;
      iVar4 = iVar5;
    } while (iVar5 != nVars);
    return 0;
  case 1:
    uVar10 = 4;
    uVar9 = 0;
    do {
      uVar11 = uVar9 + 1;
      uVar6 = uVar11;
      if ((int)uVar11 < nVars) {
        local_b0 = CONCAT44(local_b0._4_4_,uVar10);
        local_98 = CONCAT44(local_98._4_4_,uVar11);
        local_b8 = (ulong)uVar9;
        do {
          iVar4 = (int)local_b8 + 2;
          local_b8 = (ulong)uVar11;
          if (iVar4 < nVars) {
            uVar12 = uVar10;
            do {
              uVar6 = 1 << ((char)uVar9 * '\x02' & 0x1fU) | 1 << (uVar12 & 0x1f) |
                      1 << ((char)uVar11 * '\x02' & 0x1fU);
              iVar5 = If_ManSatCheckXY(local_60,3,local_58,nVars,uVar6,(word *)0x0,(word *)0x0,
                                       local_50);
              if (iVar5 != 0) {
                return uVar6;
              }
              iVar4 = iVar4 + 1;
              uVar12 = uVar12 + 2;
            } while (iVar4 < nVars);
          }
          uVar11 = (int)local_b8 + 1;
          uVar10 = uVar10 + 2;
        } while (uVar11 != nVars);
        uVar11 = (uint)local_98;
        uVar6 = nVars;
        uVar10 = (uint)local_b0;
        uVar12 = (uint)local_70;
      }
      uVar10 = uVar10 + 2;
      uVar9 = uVar11;
      local_d4[0] = uVar6;
    } while (uVar11 != nVars);
    if (uVar12 != 0) {
      local_d8 = 0;
      do {
        uVar12 = local_d8 + 1;
        local_d4[0] = uVar12;
        if ((int)uVar12 < nVars) {
          uVar10 = 1 << ((char)local_d8 * '\x02' & 0x1fU);
          uVar9 = local_d8;
          uVar11 = uVar12;
          do {
            iVar4 = uVar9 + 2;
            local_d4[1] = iVar4;
            if (iVar4 < nVars) {
              uVar9 = 1 << ((char)uVar11 * '\x02' & 0x1fU);
              local_b8 = CONCAT44(local_b8._4_4_,uVar10);
              local_b0 = CONCAT44(local_b0._4_4_,uVar9);
              local_d4[0] = uVar11;
              do {
                lVar13 = 0;
                local_d4[1] = iVar4;
                do {
                  uVar6 = 3 << ((char)(&local_d8)[lVar13] * '\x02' & 0x1fU) |
                          uVar10 | 1 << (iVar4 * 2 & 0x1fU) | uVar9;
                  iVar5 = If_ManSatCheckXY(local_60,3,local_58,nVars,uVar6,(word *)0x0,(word *)0x0,
                                           local_50);
                  if (iVar5 != 0) {
                    return uVar6;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                iVar4 = iVar4 + 1;
                local_d4[1] = iVar4;
                uVar10 = (uint)local_b8;
                uVar9 = (uint)local_b0;
              } while (iVar4 < nVars);
            }
            local_d4[0] = uVar11 + 1;
            uVar9 = uVar11;
            uVar11 = local_d4[0];
          } while (local_d4[0] != nVars);
        }
        local_d8 = uVar12;
      } while (uVar12 != nVars);
      return 0;
    }
    break;
  case 2:
    uVar14 = 0;
    uVar9 = 6;
    do {
      uVar10 = (int)uVar14 + 1;
      uVar17 = (ulong)uVar10;
      if ((int)uVar10 < nVars) {
        cVar1 = (char)uVar14;
        local_a0 = CONCAT44(local_a0._4_4_,uVar9);
        local_90 = CONCAT44(local_90._4_4_,uVar10);
        uVar8 = uVar17;
        uVar12 = uVar9;
        do {
          uVar10 = (int)uVar14 + 2;
          uVar14 = uVar17;
          if ((int)uVar10 < nVars) {
            local_98 = CONCAT44(local_98._4_4_,uVar12);
            local_88 = uVar17;
            uVar9 = uVar12;
            do {
              iVar4 = uVar10 + 1;
              if (nVars <= iVar4) break;
              local_b8 = CONCAT44(local_b8._4_4_,uVar9);
              local_b0 = CONCAT44(local_b0._4_4_,iVar4);
              do {
                uVar12 = 1 << (cVar1 * '\x02' & 0x1fU) | 1 << (uVar9 & 0x1f) |
                         1 << ((char)uVar17 * '\x02' & 0x1fU) | 1 << ((char)uVar10 * '\x02' & 0x1fU)
                ;
                iVar5 = If_ManSatCheckXY(local_60,4,local_58,nVars,uVar12,(word *)0x0,(word *)0x0,
                                         local_50);
                if (iVar5 != 0) {
                  return uVar12;
                }
                iVar4 = iVar4 + 1;
                uVar9 = uVar9 + 2;
              } while (iVar4 < nVars);
              uVar9 = (uint)local_b8 + 2;
              uVar12 = (uint)local_98;
              uVar10 = (uint)local_b0;
              local_d4[2] = nVars;
            } while ((int)(uint)local_b0 < nVars);
            uVar8 = local_90 & 0xffffffff;
            uVar14 = local_88;
            uVar9 = (uint)local_a0;
            uVar10 = nVars;
          }
          uVar11 = (int)uVar14 + 1;
          uVar17 = (ulong)uVar11;
          uVar12 = uVar12 + 2;
          local_d4[1] = uVar10;
        } while (uVar11 != nVars);
        uVar17 = uVar8;
        uVar10 = nVars;
        uVar12 = (uint)local_70;
      }
      uVar14 = uVar17;
      uVar9 = uVar9 + 2;
      local_d4[0] = uVar10;
    } while ((int)uVar14 != nVars);
    if (uVar12 != 0) {
      local_d8 = 0;
      do {
        uVar9 = local_d8 + 1;
        local_d4[0] = uVar9;
        if ((int)uVar9 < nVars) {
          uVar11 = 1 << ((char)local_d8 * '\x02' & 0x1fU);
          uVar10 = local_d8;
          uVar6 = uVar9;
          do {
            local_d4[1] = uVar10 + 2;
            if ((int)local_d4[1] < nVars) {
              uVar10 = 1 << ((char)uVar6 * '\x02' & 0x1fU);
              local_d4[0] = uVar6;
              do {
                iVar4 = local_d4[1] + 1;
                local_d4[2] = iVar4;
                if (nVars <= iVar4) break;
                uVar12 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                local_88 = CONCAT44(local_88._4_4_,iVar4);
                local_b8 = CONCAT44(local_b8._4_4_,uVar11);
                local_b0 = CONCAT44(local_b0._4_4_,uVar10);
                local_98 = CONCAT44(local_98._4_4_,uVar12);
                do {
                  lVar13 = 0;
                  local_d4[2] = iVar4;
                  do {
                    uVar16 = 3 << ((char)(&local_d8)[lVar13] * '\x02' & 0x1fU) |
                             uVar11 | 1 << (iVar4 * 2 & 0x1fU) | uVar10 | uVar12;
                    iVar5 = If_ManSatCheckXY(local_60,4,local_58,nVars,uVar16,(word *)0x0,
                                             (word *)0x0,local_50);
                    if (iVar5 != 0) {
                      return uVar16;
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 4);
                  iVar4 = iVar4 + 1;
                  local_d4[2] = iVar4;
                  uVar11 = (uint)local_b8;
                  uVar10 = (uint)local_b0;
                  uVar12 = (uint)local_98;
                } while (iVar4 < nVars);
                local_d4[1] = (uint)local_88;
                uVar12 = (uint)local_70;
              } while ((int)(uint)local_88 < nVars);
            }
            local_d4[0] = uVar6 + 1;
            uVar10 = uVar6;
            uVar6 = local_d4[0];
          } while (local_d4[0] != nVars);
        }
        local_d8 = uVar9;
      } while (uVar9 != nVars);
      if (1 < (int)uVar12) {
        local_d8 = 0;
        uVar14 = 0;
        do {
          uVar12 = (int)uVar14 + 1;
          local_d4[0] = uVar12;
          if ((int)uVar12 < nVars) {
            local_b8 = CONCAT44(local_b8._4_4_,1 << ((char)uVar14 * '\x02' & 0x1fU));
            do {
              local_88 = (ulong)local_d4[0];
              local_d4[1] = (int)uVar14 + 2;
              if ((int)local_d4[1] < nVars) {
                local_b0 = CONCAT44(local_b0._4_4_,1 << ((char)local_d4[0] * '\x02' & 0x1fU));
                local_a0 = CONCAT44(local_a0._4_4_,uVar12);
                do {
                  local_d4[2] = local_d4[1] + 1;
                  if (nVars <= (int)local_d4[2]) {
                    uVar12 = (uint)local_a0;
                    break;
                  }
                  uVar12 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                  local_90 = CONCAT44(local_90._4_4_,local_d4[2]);
                  local_98 = CONCAT44(local_98._4_4_,uVar12);
                  do {
                    local_70 = (ulong)local_d4[2];
                    uVar9 = (uint)local_b8 | 1 << (local_d4[2] * 2 & 0x1f) | (uint)local_b0;
                    lVar13 = 1;
                    uVar14 = 0;
                    do {
                      if (uVar14 < 3) {
                        uVar10 = (&local_d8)[uVar14];
                        lVar7 = lVar13;
                        do {
                          uVar11 = 3 << ((char)(&local_d8)[lVar7] * '\x02' & 0x1fU) |
                                   3 << ((char)uVar10 * '\x02' & 0x1fU) | uVar9 | uVar12;
                          iVar4 = If_ManSatCheckXY(local_60,4,local_58,nVars,uVar11,(word *)0x0,
                                                   (word *)0x0,local_50);
                          if (iVar4 != 0) {
                            return uVar11;
                          }
                          lVar7 = lVar7 + 1;
                        } while (lVar7 != 4);
                      }
                      uVar14 = uVar14 + 1;
                      lVar13 = lVar13 + 1;
                    } while (uVar14 != 4);
                    local_d4[2] = (int)local_70 + 1;
                    uVar12 = (uint)local_98;
                  } while ((int)local_d4[2] < nVars);
                  local_d4[1] = (uint)local_90;
                  uVar12 = (uint)local_a0;
                } while ((int)(uint)local_90 < nVars);
              }
              local_d4[0] = (int)local_88 + 1;
              uVar14 = local_88;
            } while (local_d4[0] != nVars);
          }
          local_d8 = uVar12;
          uVar14 = (ulong)uVar12;
          if (uVar12 == nVars) {
            return 0;
          }
        } while( true );
      }
    }
    break;
  case 3:
    uVar14 = 0;
    uVar9 = 8;
    do {
      uVar10 = (int)uVar14 + 1;
      uVar8 = (ulong)uVar10;
      uVar17 = uVar8;
      if ((int)uVar10 < nVars) {
        local_b8 = CONCAT44(local_b8._4_4_,1 << ((char)uVar14 * '\x02' & 0x1fU));
        local_a4 = uVar9;
        local_68 = CONCAT44(local_68._4_4_,uVar10);
        uVar11 = uVar9;
        do {
          uVar6 = (int)uVar14 + 2;
          uVar14 = uVar8;
          if ((int)uVar6 < nVars) {
            local_78 = uVar8;
            local_90 = CONCAT44(local_90._4_4_,uVar11);
            uVar9 = uVar11;
            do {
              uVar14 = (ulong)uVar6;
              uVar10 = uVar6 + 1;
              if (nVars <= (int)uVar10) break;
              local_88 = CONCAT44(local_88._4_4_,uVar9);
              local_a0 = CONCAT44(local_a0._4_4_,uVar10);
              do {
                iVar4 = (int)uVar14 + 2;
                uVar14 = (ulong)uVar10;
                if (iVar4 < nVars) {
                  local_98 = CONCAT44(local_98._4_4_,uVar9);
                  local_b0 = (ulong)uVar10;
                  do {
                    uVar12 = (uint)local_b8 | 1 << (uVar9 & 0x1f) |
                             1 << ((char)uVar8 * '\x02' & 0x1fU) |
                             1 << ((char)uVar6 * '\x02' & 0x1fU) |
                             1 << ((char)uVar10 * '\x02' & 0x1fU);
                    iVar5 = If_ManSatCheckXY(local_60,5,local_58,nVars,uVar12,(word *)0x0,
                                             (word *)0x0,local_50);
                    if (iVar5 != 0) {
                      return uVar12;
                    }
                    iVar4 = iVar4 + 1;
                    uVar9 = uVar9 + 2;
                  } while (iVar4 < nVars);
                  uVar14 = local_b0;
                  uVar9 = (uint)local_98;
                  iVar4 = nVars;
                }
                local_d4[3] = iVar4;
                uVar10 = (int)uVar14 + 1;
                uVar9 = uVar9 + 2;
              } while ((int)uVar10 < nVars);
              uVar9 = (uint)local_88 + 2;
              uVar6 = (uint)local_a0;
              uVar11 = (uint)local_90;
              local_d4[2] = nVars;
              uVar12 = (uint)local_70;
            } while ((int)(uint)local_a0 < nVars);
            uVar17 = local_68 & 0xffffffff;
            uVar14 = local_78;
            uVar9 = local_a4;
            uVar6 = nVars;
          }
          uVar16 = (int)uVar14 + 1;
          uVar8 = (ulong)uVar16;
          uVar11 = uVar11 + 2;
          uVar10 = nVars;
          local_d4[1] = uVar6;
        } while (uVar16 != nVars);
      }
      uVar14 = uVar17;
      uVar9 = uVar9 + 2;
      local_d4[0] = uVar10;
    } while ((int)uVar14 != nVars);
    if (uVar12 != 0) {
      local_d8 = 0;
      do {
        uVar9 = local_d8 + 1;
        local_d4[0] = uVar9;
        if ((int)uVar9 < nVars) {
          uVar11 = 1 << ((char)local_d8 * '\x02' & 0x1fU);
          uVar10 = local_d8;
          uVar6 = uVar9;
          do {
            local_d4[1] = uVar10 + 2;
            if ((int)local_d4[1] < nVars) {
              uVar10 = 1 << ((char)uVar6 * '\x02' & 0x1fU);
              local_d4[0] = uVar6;
              do {
                local_d4[2] = local_d4[1] + 1;
                if (nVars <= (int)local_d4[2]) break;
                local_a0 = CONCAT44(local_a0._4_4_,uVar9);
                uVar9 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                local_90 = CONCAT44(local_90._4_4_,local_d4[2]);
                iVar4 = local_d4[1];
                do {
                  iVar5 = local_d4[2];
                  iVar4 = iVar4 + 2;
                  local_d4[3] = iVar4;
                  if (iVar4 < nVars) {
                    uVar16 = 1 << ((char)iVar5 * '\x02' & 0x1fU);
                    local_b8 = CONCAT44(local_b8._4_4_,uVar11);
                    local_b0 = CONCAT44(local_b0._4_4_,uVar10);
                    local_98 = CONCAT44(local_98._4_4_,uVar9);
                    local_88 = CONCAT44(local_88._4_4_,uVar16);
                    local_d4[2] = iVar5;
                    do {
                      lVar13 = 0;
                      local_d4[3] = iVar4;
                      do {
                        uVar12 = 3 << ((char)(&local_d8)[lVar13] * '\x02' & 0x1fU) |
                                 uVar11 | 1 << (iVar4 * 2 & 0x1fU) | uVar10 | uVar9 | uVar16;
                        iVar3 = If_ManSatCheckXY(local_60,5,local_58,nVars,uVar12,(word *)0x0,
                                                 (word *)0x0,local_50);
                        if (iVar3 != 0) {
                          return uVar12;
                        }
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 5);
                      iVar4 = iVar4 + 1;
                      local_d4[3] = iVar4;
                      uVar11 = (uint)local_b8;
                      uVar10 = (uint)local_b0;
                      uVar9 = (uint)local_98;
                      uVar12 = (uint)local_70;
                      uVar16 = (uint)local_88;
                    } while (iVar4 < nVars);
                  }
                  local_d4[2] = iVar5 + 1;
                  iVar4 = iVar5;
                } while ((int)local_d4[2] < nVars);
                local_d4[1] = (uint)local_90;
                uVar9 = (uint)local_a0;
              } while ((int)(uint)local_90 < nVars);
            }
            local_d4[0] = uVar6 + 1;
            uVar10 = uVar6;
            uVar6 = local_d4[0];
          } while (local_d4[0] != nVars);
        }
        local_d8 = uVar9;
      } while (uVar9 != nVars);
      if (1 < (int)uVar12) {
        local_d8 = 0;
        uVar14 = 0;
        do {
          uVar12 = (int)uVar14 + 1;
          local_d4[0] = uVar12;
          if ((int)uVar12 < nVars) {
            local_b0 = CONCAT44(local_b0._4_4_,1 << ((char)uVar14 * '\x02' & 0x1fU));
            local_90 = CONCAT44(local_90._4_4_,uVar12);
            do {
              local_d4[1] = (int)uVar14 + 2;
              uVar14 = (ulong)local_d4[0];
              if ((int)local_d4[1] < nVars) {
                local_b8 = CONCAT44(local_b8._4_4_,1 << ((char)local_d4[0] * '\x02' & 0x1fU));
                local_a0 = (ulong)local_d4[0];
                do {
                  local_d4[2] = local_d4[1] + 1;
                  if (nVars <= (int)local_d4[2]) {
                    uVar14 = local_a0;
                    uVar12 = (uint)local_90;
                    break;
                  }
                  local_98 = CONCAT44(local_98._4_4_,1 << ((char)local_d4[1] * '\x02' & 0x1fU));
                  local_a4 = local_d4[2];
                  iVar5 = local_d4[1];
                  iVar4 = local_d4[2];
                  do {
                    local_d4[3] = iVar5 + 2;
                    if ((int)local_d4[3] < nVars) {
                      uVar12 = 1 << ((char)iVar4 * '\x02' & 0x1fU);
                      local_78 = CONCAT44(local_78._4_4_,uVar12);
                      local_d4[2] = iVar4;
                      do {
                        local_88 = (ulong)local_d4[3];
                        uVar9 = (uint)local_b0 | 1 << (local_d4[3] * 2 & 0x1f) | (uint)local_b8 |
                                (uint)local_98;
                        uVar14 = 0;
                        do {
                          if (uVar14 < 4) {
                            uVar10 = (&local_d8)[uVar14];
                            uVar17 = uVar14;
                            do {
                              uVar11 = 3 << ((char)local_d4[uVar17] * '\x02' & 0x1fU) |
                                       3 << ((char)uVar10 * '\x02' & 0x1fU) | uVar9 | uVar12;
                              iVar5 = If_ManSatCheckXY(local_60,5,local_58,nVars,uVar11,(word *)0x0,
                                                       (word *)0x0,local_50);
                              if (iVar5 != 0) {
                                return uVar11;
                              }
                              uVar17 = uVar17 + 1;
                            } while (uVar17 != 4);
                          }
                          uVar14 = uVar14 + 1;
                        } while (uVar14 != 5);
                        local_d4[3] = (int)local_88 + 1;
                        uVar12 = (uint)local_78;
                      } while ((int)local_d4[3] < nVars);
                    }
                    local_d4[2] = iVar4 + 1;
                    iVar5 = iVar4;
                    iVar4 = local_d4[2];
                  } while ((int)local_d4[2] < nVars);
                  local_d4[1] = local_a4;
                  uVar14 = local_a0;
                  uVar12 = (uint)local_90;
                } while ((int)local_a4 < nVars);
              }
              local_d4[0] = (int)uVar14 + 1;
            } while (local_d4[0] != nVars);
          }
          local_d8 = uVar12;
          uVar14 = (ulong)uVar12;
        } while (uVar12 != nVars);
        if ((uint)local_70 != 2) {
          local_d8 = 0;
          local_b8 = 0;
          do {
            local_d4[0] = (int)local_b8 + 1;
            local_70 = CONCAT44(local_70._4_4_,local_d4[0]);
            if ((int)local_d4[0] < nVars) {
              local_78 = CONCAT44(local_78._4_4_,1 << ((char)local_b8 * '\x02' & 0x1fU));
              do {
                uVar14 = local_b8;
                local_b8 = (ulong)local_d4[0];
                local_d4[1] = (int)uVar14 + 2;
                if ((int)local_d4[1] < nVars) {
                  local_90 = CONCAT44(local_90._4_4_,1 << ((char)local_d4[0] * '\x02' & 0x1fU));
                  do {
                    local_d4[2] = local_d4[1] + 1;
                    local_a0 = CONCAT44(local_a0._4_4_,local_d4[2]);
                    if (nVars <= (int)local_d4[2]) break;
                    local_a4 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                    iVar4 = local_d4[1];
                    iVar5 = local_d4[2];
                    do {
                      local_d4[3] = iVar4 + 2;
                      local_98 = (ulong)local_d4[3];
                      if ((int)local_d4[3] < nVars) {
                        local_68 = CONCAT44(local_68._4_4_,1 << ((char)iVar5 * '\x02' & 0x1fU));
                        local_d4[2] = iVar5;
                        do {
                          local_88 = CONCAT44(local_88._4_4_,
                                              (uint)local_78 | 1 << ((int)local_98 * 2 & 0x1fU) |
                                              (uint)local_90 | local_a4 | (uint)local_68);
                          local_b0 = 1;
                          uVar14 = 0;
                          do {
                            uVar17 = local_b0;
                            if (uVar14 < 4) {
                              do {
                                if (uVar17 < 4) {
                                  uVar12 = 3 << ((char)(&local_d8)[uVar17] * '\x02' & 0x1fU) |
                                           3 << ((char)(&local_d8)[uVar14] * '\x02' & 0x1fU) |
                                           (uint)local_88;
                                  uVar8 = uVar17;
                                  do {
                                    uVar9 = 3 << ((char)local_d4[uVar8] * '\x02' & 0x1fU) | uVar12;
                                    iVar4 = If_ManSatCheckXY(local_60,5,local_58,nVars,uVar9,
                                                             (word *)0x0,(word *)0x0,local_50);
                                    if (iVar4 != 0) {
                                      return uVar9;
                                    }
                                    uVar8 = uVar8 + 1;
                                  } while (uVar8 < 4);
                                }
                                uVar17 = uVar17 + 1;
                              } while (uVar17 != 5);
                            }
                            uVar14 = uVar14 + 1;
                            local_b0 = local_b0 + 1;
                          } while (uVar14 != 5);
                          local_d4[3] = (int)local_98 + 1;
                          local_98 = (ulong)local_d4[3];
                        } while ((int)local_d4[3] < nVars);
                      }
                      local_d4[2] = iVar5 + 1;
                      iVar4 = iVar5;
                      iVar5 = local_d4[2];
                    } while ((int)local_d4[2] < nVars);
                    local_d4[1] = (uint)local_a0;
                  } while ((int)(uint)local_a0 < nVars);
                }
                local_d4[0] = (int)local_b8 + 1;
              } while (local_d4[0] != nVars);
            }
            local_d8 = (uint)local_70;
            local_b8 = local_70 & 0xffffffff;
            if ((uint)local_70 == nVars) {
              return 0;
            }
          } while( true );
        }
      }
    }
    break;
  default:
    uVar14 = 0;
    uVar9 = 10;
    do {
      uVar10 = (int)uVar14 + 1;
      uVar8 = (ulong)uVar10;
      uVar17 = uVar8;
      if ((int)uVar10 < nVars) {
        local_b0 = CONCAT44(local_b0._4_4_,1 << ((char)uVar14 * '\x02' & 0x1fU));
        local_44 = uVar9;
        local_40 = uVar10;
        local_a4 = uVar9;
        do {
          uVar11 = (int)uVar14 + 2;
          uVar14 = uVar8;
          uVar10 = local_a4;
          if ((int)uVar11 < nVars) {
            local_b8 = CONCAT44(local_b8._4_4_,1 << ((char)uVar8 * '\x02' & 0x1fU));
            local_68 = uVar8;
            local_7c = local_a4;
            uVar8 = (ulong)uVar11;
            do {
              uVar6 = (int)uVar8 + 1;
              uVar15 = (ulong)uVar6;
              uVar14 = local_68;
              uVar11 = nVars;
              uVar10 = local_7c;
              if (nVars <= (int)uVar6) break;
              cVar1 = (char)uVar8;
              local_78 = CONCAT44(local_78._4_4_,uVar6);
              uVar9 = local_a4;
              do {
                iVar4 = (int)uVar8 + 2;
                uVar8 = (ulong)uVar6;
                if (iVar4 < nVars) {
                  local_a0 = CONCAT44(local_a0._4_4_,uVar9);
                  local_90 = (ulong)uVar6;
                  uVar10 = uVar9;
                  do {
                    uVar16 = iVar4 + 1;
                    if (nVars <= (int)uVar16) break;
                    local_98 = CONCAT44(local_98._4_4_,uVar10);
                    local_88 = CONCAT44(local_88._4_4_,uVar16);
                    do {
                      uVar12 = (uint)local_b0 | 1 << (uVar10 & 0x1f) | (uint)local_b8 |
                               1 << (cVar1 * '\x02' & 0x1fU) | 1 << ((char)uVar6 * '\x02' & 0x1fU) |
                               1 << ((char)iVar4 * '\x02' & 0x1fU);
                      iVar5 = If_ManSatCheckXY(local_60,6,local_58,nVars,uVar12,(word *)0x0,
                                               (word *)0x0,local_50);
                      if (iVar5 != 0) {
                        return uVar12;
                      }
                      uVar16 = uVar16 + 1;
                      uVar10 = uVar10 + 2;
                    } while ((int)uVar16 < nVars);
                    uVar10 = (uint)local_98 + 2;
                    iVar4 = (uint)local_88;
                    uVar9 = (uint)local_a0;
                    local_c4 = nVars;
                    uVar16 = nVars;
                    uVar12 = (uint)local_70;
                  } while ((int)(uint)local_88 < nVars);
                  local_c4 = uVar16;
                  uVar15 = local_78 & 0xffffffff;
                  uVar8 = local_90;
                  iVar4 = nVars;
                }
                uVar6 = (int)uVar8 + 1;
                uVar9 = uVar9 + 2;
                local_d4[3] = iVar4;
              } while ((int)uVar6 < nVars);
              local_a4 = local_a4 + 2;
              uVar17 = (ulong)local_40;
              uVar14 = local_68;
              uVar8 = uVar15;
              uVar9 = local_44;
              uVar10 = local_7c;
              local_d4[2] = nVars;
            } while ((int)uVar15 < nVars);
          }
          uVar6 = (int)uVar14 + 1;
          uVar8 = (ulong)uVar6;
          local_a4 = uVar10 + 2;
          uVar10 = nVars;
          local_d4[1] = uVar11;
        } while (uVar6 != nVars);
      }
      uVar14 = uVar17;
      uVar9 = uVar9 + 2;
      local_d4[0] = uVar10;
    } while ((int)uVar14 != nVars);
    if (uVar12 != 0) {
      local_d8 = 0;
      do {
        uVar9 = local_d8 + 1;
        local_d4[0] = uVar9;
        if ((int)uVar9 < nVars) {
          uVar10 = 1 << ((char)local_d8 * '\x02' & 0x1fU);
          uVar14 = (ulong)local_d8;
          do {
            uVar17 = (ulong)local_d4[0];
            local_d4[1] = (int)uVar14 + 2;
            if ((int)local_d4[1] < nVars) {
              uVar11 = 1 << ((char)local_d4[0] * '\x02' & 0x1fU);
              do {
                iVar4 = local_d4[1] + 1;
                local_d4[2] = iVar4;
                if (nVars <= iVar4) break;
                uVar6 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                iVar5 = local_d4[1];
                do {
                  iVar3 = local_d4[2];
                  local_d4[3] = iVar5 + 2;
                  if ((int)local_d4[3] < nVars) {
                    uVar16 = 1 << ((char)iVar3 * '\x02' & 0x1fU);
                    local_d4[2] = iVar3;
                    do {
                      iVar5 = local_d4[3] + 1;
                      local_c4 = iVar5;
                      if (nVars <= iVar5) break;
                      local_90 = CONCAT44(local_90._4_4_,iVar4);
                      local_a0 = CONCAT44(local_a0._4_4_,uVar9);
                      local_88 = uVar17;
                      cVar1 = (char)local_d4[3];
                      local_78 = CONCAT44(local_78._4_4_,uVar16);
                      local_a4 = iVar5;
                      local_b8 = CONCAT44(local_b8._4_4_,uVar10);
                      local_b0 = CONCAT44(local_b0._4_4_,uVar11);
                      local_98 = CONCAT44(local_98._4_4_,uVar6);
                      do {
                        lVar13 = 0;
                        local_c4 = iVar5;
                        do {
                          uVar12 = 3 << ((char)(&local_d8)[lVar13] * '\x02' & 0x1fU) |
                                   uVar10 | 1 << (iVar5 * 2 & 0x1fU) | uVar11 | uVar6 |
                                   1 << (cVar1 * '\x02' & 0x1fU) | uVar16;
                          iVar4 = If_ManSatCheckXY(local_60,6,local_58,nVars,uVar12,(word *)0x0,
                                                   (word *)0x0,local_50);
                          if (iVar4 != 0) {
                            return uVar12;
                          }
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 6);
                        iVar5 = iVar5 + 1;
                        local_c4 = iVar5;
                        uVar6 = (uint)local_98;
                        uVar10 = (uint)local_b8;
                        uVar11 = (uint)local_b0;
                      } while (iVar5 < nVars);
                      local_d4[3] = local_a4;
                      uVar17 = local_88;
                      uVar9 = (uint)local_a0;
                      iVar4 = (uint)local_90;
                      uVar16 = (uint)local_78;
                      uVar12 = (uint)local_70;
                    } while ((int)local_a4 < nVars);
                  }
                  local_d4[2] = iVar3 + 1;
                  iVar5 = iVar3;
                } while ((int)local_d4[2] < nVars);
                local_d4[1] = iVar4;
              } while (iVar4 < nVars);
            }
            local_d4[0] = (int)uVar17 + 1;
            uVar14 = uVar17;
          } while (local_d4[0] != nVars);
        }
        local_d8 = uVar9;
      } while (uVar9 != nVars);
      if (1 < (int)uVar12) {
        local_d8 = 0;
        uVar14 = 0;
        do {
          uVar12 = (int)uVar14 + 1;
          local_d4[0] = uVar12;
          if ((int)uVar12 < nVars) {
            local_b0 = CONCAT44(local_b0._4_4_,1 << ((char)uVar14 * '\x02' & 0x1fU));
            local_78 = CONCAT44(local_78._4_4_,uVar12);
            do {
              local_d4[1] = (int)uVar14 + 2;
              uVar14 = (ulong)local_d4[0];
              if ((int)local_d4[1] < nVars) {
                local_b8 = CONCAT44(local_b8._4_4_,1 << ((char)local_d4[0] * '\x02' & 0x1fU));
                local_90 = (ulong)local_d4[0];
                do {
                  uVar14 = (ulong)local_d4[1];
                  local_d4[2] = local_d4[1] + 1;
                  if (nVars <= (int)local_d4[2]) {
                    uVar14 = local_90;
                    uVar12 = (uint)local_78;
                    break;
                  }
                  local_98 = CONCAT44(local_98._4_4_,1 << ((char)local_d4[1] * '\x02' & 0x1fU));
                  local_7c = local_d4[2];
                  do {
                    local_d4[3] = (int)uVar14 + 2;
                    uVar14 = (ulong)local_d4[2];
                    if ((int)local_d4[3] < nVars) {
                      local_88 = CONCAT44(local_88._4_4_,1 << ((char)local_d4[2] * '\x02' & 0x1fU));
                      local_68 = (ulong)local_d4[2];
                      do {
                        local_c4 = local_d4[3] + 1;
                        uVar14 = local_68;
                        if (nVars <= (int)local_c4) break;
                        local_44 = local_c4;
                        local_a4 = 1 << ((char)local_d4[3] * '\x02' & 0x1fU) | (uint)local_88;
                        do {
                          local_a0 = (ulong)local_c4;
                          uVar12 = (uint)local_b0 | 1 << (local_c4 * 2 & 0x1f) | (uint)local_b8 |
                                   (uint)local_98 | local_a4;
                          lVar13 = 1;
                          uVar14 = 0;
                          do {
                            if (uVar14 < 5) {
                              uVar9 = (&local_d8)[uVar14];
                              lVar7 = lVar13;
                              do {
                                uVar10 = 3 << ((char)(&local_d8)[lVar7] * '\x02' & 0x1fU) |
                                         3 << ((char)uVar9 * '\x02' & 0x1fU) | uVar12;
                                iVar4 = If_ManSatCheckXY(local_60,6,local_58,nVars,uVar10,
                                                         (word *)0x0,(word *)0x0,local_50);
                                if (iVar4 != 0) {
                                  return uVar10;
                                }
                                lVar7 = lVar7 + 1;
                              } while (lVar7 != 6);
                            }
                            uVar14 = uVar14 + 1;
                            lVar13 = lVar13 + 1;
                          } while (uVar14 != 6);
                          local_c4 = (int)local_a0 + 1;
                        } while ((int)local_c4 < nVars);
                        local_d4[3] = local_44;
                        uVar14 = local_68;
                      } while ((int)local_44 < nVars);
                    }
                    local_d4[2] = (int)uVar14 + 1;
                  } while ((int)local_d4[2] < nVars);
                  local_d4[1] = local_7c;
                  uVar14 = local_90;
                  uVar12 = (uint)local_78;
                } while ((int)local_7c < nVars);
              }
              local_d4[0] = (int)uVar14 + 1;
            } while (local_d4[0] != nVars);
          }
          local_d8 = uVar12;
          uVar14 = (ulong)uVar12;
        } while (uVar12 != nVars);
        if ((uint)local_70 != 2) {
          local_d8 = 0;
          local_b8 = 0;
          do {
            local_d4[0] = (int)local_b8 + 1;
            local_88 = CONCAT44(local_88._4_4_,local_d4[0]);
            if ((int)local_d4[0] < nVars) {
              local_a4 = 1 << ((char)local_b8 * '\x02' & 0x1fU);
              do {
                uVar14 = local_b8;
                local_b8 = (ulong)local_d4[0];
                local_d4[1] = (int)uVar14 + 2;
                local_b0 = (ulong)local_d4[1];
                if ((int)local_d4[1] < nVars) {
                  local_78 = CONCAT44(local_78._4_4_,1 << ((char)local_d4[0] * '\x02' & 0x1fU));
                  do {
                    local_d4[2] = (int)local_b0 + 1;
                    local_a0 = CONCAT44(local_a0._4_4_,local_d4[2]);
                    if (nVars <= (int)local_d4[2]) break;
                    local_68 = CONCAT44(local_68._4_4_,1 << ((char)local_b0 * '\x02' & 0x1fU));
                    do {
                      uVar14 = local_b0;
                      local_b0 = (ulong)local_d4[2];
                      local_d4[3] = (int)uVar14 + 2;
                      if ((int)local_d4[3] < nVars) {
                        local_40 = 1 << ((char)local_d4[2] * '\x02' & 0x1fU);
                        do {
                          local_c4 = local_d4[3] + 1;
                          local_7c = local_c4;
                          if (nVars <= (int)local_c4) break;
                          local_44 = 1 << ((char)local_d4[3] * '\x02' & 0x1fU) | local_40;
                          local_90 = (ulong)local_c4;
                          do {
                            uVar12 = local_a4 | 1 << ((int)local_90 * 2 & 0x1fU) | (uint)local_78 |
                                     (uint)local_68 | local_44;
                            local_98 = 1;
                            uVar14 = 0;
                            do {
                              uVar17 = local_98;
                              if (uVar14 < 5) {
                                do {
                                  if (uVar17 < 5) {
                                    uVar9 = (&local_d8)[uVar14];
                                    uVar10 = (&local_d8)[uVar17];
                                    uVar8 = uVar17;
                                    do {
                                      uVar11 = 3 << ((char)local_d4[uVar8] * '\x02' & 0x1fU) |
                                               3 << ((char)uVar10 * '\x02' & 0x1fU) |
                                               3 << ((char)uVar9 * '\x02' & 0x1fU) | uVar12;
                                      iVar4 = If_ManSatCheckXY(local_60,6,local_58,nVars,uVar11,
                                                               (word *)0x0,(word *)0x0,local_50);
                                      if (iVar4 != 0) {
                                        return uVar11;
                                      }
                                      uVar8 = uVar8 + 1;
                                    } while (uVar8 < 5);
                                  }
                                  uVar17 = uVar17 + 1;
                                } while (uVar17 != 6);
                              }
                              uVar14 = uVar14 + 1;
                              local_98 = local_98 + 1;
                            } while (uVar14 != 6);
                            local_c4 = (int)local_90 + 1;
                            local_90 = (ulong)local_c4;
                          } while ((int)local_c4 < nVars);
                          local_d4[3] = local_7c;
                        } while ((int)local_7c < nVars);
                      }
                      local_d4[2] = (int)local_b0 + 1;
                    } while ((int)local_d4[2] < nVars);
                    local_d4[1] = (uint)local_a0;
                    local_b0 = local_a0 & 0xffffffff;
                  } while ((int)(uint)local_a0 < nVars);
                }
                local_d4[0] = (int)local_b8 + 1;
              } while (local_d4[0] != nVars);
            }
            local_d8 = (uint)local_88;
            local_b8 = local_88 & 0xffffffff;
          } while ((uint)local_88 != nVars);
          if (3 < (int)(uint)local_70) {
            local_d8 = 0;
            local_b8 = 0;
            do {
              local_d4[0] = (int)local_b8 + 1;
              local_70 = CONCAT44(local_70._4_4_,local_d4[0]);
              if ((int)local_d4[0] < nVars) {
                local_40 = 1 << ((char)local_b8 * '\x02' & 0x1fU);
                do {
                  uVar14 = local_b8;
                  local_b8 = (ulong)local_d4[0];
                  local_d4[1] = (int)uVar14 + 2;
                  if ((int)local_d4[1] < nVars) {
                    local_44 = 1 << ((char)local_d4[0] * '\x02' & 0x1fU);
                    do {
                      local_b0 = (ulong)local_d4[1];
                      local_d4[2] = local_d4[1] + 1;
                      local_a4 = local_d4[2];
                      if (nVars <= (int)local_d4[2]) break;
                      local_34 = 1 << ((char)local_d4[1] * '\x02' & 0x1fU);
                      do {
                        uVar14 = local_b0;
                        local_b0 = (ulong)local_d4[2];
                        local_d4[3] = (int)uVar14 + 2;
                        if ((int)local_d4[3] < nVars) {
                          local_3c = 1 << ((char)local_d4[2] * '\x02' & 0x1fU);
                          do {
                            local_c4 = local_d4[3] + 1;
                            local_7c = local_c4;
                            if (nVars <= (int)local_c4) break;
                            local_38 = 1 << ((char)local_d4[3] * '\x02' & 0x1fU) | local_3c;
                            local_68 = (ulong)local_c4;
                            do {
                              local_90 = CONCAT44(local_90._4_4_,
                                                  local_40 | 1 << ((int)local_68 * 2 & 0x1fU) |
                                                  local_44 | local_34 | local_38);
                              local_98 = 2;
                              local_88 = 1;
                              uVar14 = 0;
                              do {
                                local_a0 = local_98;
                                uVar17 = local_88;
                                if (uVar14 < 5) {
                                  do {
                                    if (uVar17 < 5) {
                                      local_78 = CONCAT44(local_78._4_4_,
                                                          3 << ((char)(&local_d8)[uVar17] * '\x02' &
                                                               0x1fU) |
                                                          3 << ((char)(&local_d8)[uVar14] * '\x02' &
                                                               0x1fU));
                                      uVar8 = local_a0;
                                      do {
                                        uVar12 = 3 << ((char)(&local_d8)[uVar8] * '\x02' & 0x1fU) |
                                                 (uint)local_78 | (uint)local_90;
                                        uVar15 = uVar17;
                                        do {
                                          uVar9 = 3 << ((char)local_d4[uVar15] * '\x02' & 0x1fU) |
                                                  uVar12;
                                          iVar4 = If_ManSatCheckXY(local_60,6,local_58,nVars,uVar9,
                                                                   (word *)0x0,(word *)0x0,local_50)
                                          ;
                                          if (iVar4 != 0) {
                                            return uVar9;
                                          }
                                          uVar15 = uVar15 + 1;
                                        } while (uVar15 < 5);
                                        bVar18 = uVar8 < 5;
                                        uVar8 = uVar8 + 1;
                                      } while (bVar18);
                                    }
                                    uVar17 = uVar17 + 1;
                                    local_a0 = local_a0 + 1;
                                  } while (uVar17 != 6);
                                }
                                uVar14 = uVar14 + 1;
                                local_98 = local_98 + 1;
                                local_88 = local_88 + 1;
                              } while (uVar14 != 6);
                              local_c4 = (int)local_68 + 1;
                              local_68 = (ulong)local_c4;
                            } while ((int)local_c4 < nVars);
                            local_d4[3] = local_7c;
                          } while ((int)local_7c < nVars);
                        }
                        local_d4[2] = (int)local_b0 + 1;
                      } while ((int)local_d4[2] < nVars);
                      local_d4[1] = local_a4;
                    } while ((int)local_a4 < nVars);
                  }
                  local_d4[0] = (int)local_b8 + 1;
                } while (local_d4[0] != nVars);
              }
              local_d8 = (uint)local_70;
              local_b8 = local_70 & 0xffffffff;
              if ((uint)local_70 == nVars) {
                return 0;
              }
            } while( true );
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

unsigned If_ManSatCheckXYall_int( void * pSat, int nLutSize, word * pTruth, int nVars, Vec_Int_t * vLits )
{
    unsigned uSet = 0;
    int nTotal = 2 * nLutSize - 1;
    int nShared = nTotal - nVars;
    int i[6], s[4];
    assert( nLutSize >= 2 && nLutSize <= 6 );
    assert( nLutSize < nVars && nVars <= nTotal );
    assert( nShared >= 0 && nShared < nLutSize - 1 );
    if ( nLutSize == 2 )
    {
        assert( nShared == 0 );
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
    }
    else if ( nLutSize == 3 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
    }
    else if ( nLutSize == 4 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3]));
            {
                for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
                for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                    if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                        return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
            }
        }
    }
    else if ( nLutSize == 5 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
    }
    else if ( nLutSize == 6 )
    {
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet, NULL, NULL, vLits) )
                return uSet;
        }
        if ( nShared < 1 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0; s[0] < nLutSize; s[0]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]]));
        }
        if ( nShared < 2 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]]));
        }
        if ( nShared < 3 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]]));
        }
        if ( nShared < 4 )
            return 0;
        for ( i[0] = 0;      i[0] < nVars; i[0]++ )
        for ( i[1] = i[0]+1; i[1] < nVars; i[1]++ )
        for ( i[2] = i[1]+1; i[2] < nVars; i[2]++ )
        for ( i[3] = i[2]+1; i[3] < nVars; i[3]++ )
        for ( i[4] = i[3]+1; i[4] < nVars; i[4]++ )
        for ( i[5] = i[4]+1; i[5] < nVars; i[5]++ )
        {
            uSet = (1 << (2*i[0])) | (1 << (2*i[1])) | (1 << (2*i[2])) | (1 << (2*i[3])) | (1 << (2*i[4])) | (1 << (2*i[5]));
            for ( s[0] = 0;      s[0] < nLutSize; s[0]++ )
            for ( s[1] = s[0]+1; s[1] < nLutSize; s[1]++ )
            for ( s[2] = s[1]+1; s[2] < nLutSize; s[2]++ )
            for ( s[3] = s[1]+1; s[3] < nLutSize; s[3]++ )
                if ( If_ManSatCheckXY(pSat, nLutSize, pTruth, nVars, uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]])), NULL, NULL, vLits) )
                    return uSet | (3 << (2*i[s[0]])) | (3 << (2*i[s[1]])) | (3 << (2*i[s[2]])) | (3 << (2*i[s[3]]));
        }
    }
    return 0;
}